

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

ON__UINT16 __thiscall ON_SubDComponentPtr::Hash16FromTypeAndId(ON_SubDComponentPtr *this)

{
  ulong uVar1;
  ON__UINT16 OVar2;
  
  uVar1 = this->m_ptr;
  if ((uVar1 & 0xfffffffffffffff8) == 0 || (uVar1 & 6) == 0) {
    return 0;
  }
  OVar2 = ON_CRC16((ushort)uVar1 & 6,4,(void *)((uVar1 & 0xfffffffffffffff8) + 8));
  return OVar2;
}

Assistant:

class ON_SubDComponentBase* ON_SubDComponentPtr::ComponentBase() const
{
  switch ((ON_SUBD_COMPONENT_TYPE_MASK & m_ptr))
  {
  case ON_SUBD_COMPONENT_TYPE_VERTEX:
  case ON_SUBD_COMPONENT_TYPE_EDGE:
  case ON_SUBD_COMPONENT_TYPE_FACE:
    // During archive id mapping, the returned value can be an archive id and not a true pointer.
    // This is in a controlled setting inside functions like ON_SubDArchiveIdMap::ConvertArchiveIdToRuntimeSymmetrySetNextPtr().
    // All public level SDK code can safely assume the returned value is a true pointer.
    // It does mean that you cannot "validate" the value returned here
    // using some constraint on what you feel is a reasonable true pointer value.
    return ((class ON_SubDComponentBase*)ON_SUBD_COMPONENT_POINTER(m_ptr));
    break;
  }
  return nullptr;
}